

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.h
# Opt level: O3

Range * __thiscall
spvtools::opt::
MakeFilterIteratorRange<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>
          (Range *__return_storage_ptr__,opt *this,
          _Node_iterator<spvtools::opt::Instruction_*,_true,_false> *begin,
          _Node_iterator<spvtools::opt::Instruction_*,_true,_false> *end,
          anon_class_24_3_72e690ea predicate)

{
  _Node_iterator_base<spvtools::opt::Instruction_*,_false> _Var1;
  bool bVar2;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
  local_78;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
  local_50;
  
  local_78.predicate_.loop = predicate.loop;
  local_78.predicate_.moved_inst = predicate.moved_inst;
  local_78.predicate_.copied_inst = predicate.copied_inst;
  _Var1._M_cur = (begin->super__Node_iterator_base<spvtools::opt::Instruction_*,_false>)._M_cur;
  local_78.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)
       (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)this;
  local_78.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)
       (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)_Var1._M_cur;
  bVar2 = FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>
          ::IsPredicateSatisfied(&local_78);
  if (_Var1._M_cur != (__node_type *)this && !bVar2) {
    do {
      this = (opt *)(((__node_type *)this)->super__Hash_node_base)._M_nxt;
      local_78.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
           (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)
           (_Node_iterator_base<spvtools::opt::Instruction_*,_false>)this;
      bVar2 = FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>
              ::IsPredicateSatisfied(&local_78);
    } while (!bVar2);
  }
  local_50.predicate_.loop = predicate.loop;
  local_50.predicate_.moved_inst = predicate.moved_inst;
  local_50.predicate_.copied_inst = predicate.copied_inst;
  local_50.cur_ =
       (_Node_iterator<spvtools::opt::Instruction_*,_true,_false>)
       (begin->super__Node_iterator_base<spvtools::opt::Instruction_*,_false>)._M_cur;
  local_50.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       local_50.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>
  ::IsPredicateSatisfied(&local_50);
  (__return_storage_ptr__->begin_).cur_.
  super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       (__node_type *)
       local_78.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  (__return_storage_ptr__->begin_).end_.
  super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur =
       (__node_type *)
       local_78.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  (__return_storage_ptr__->begin_).predicate_.moved_inst = local_78.predicate_.moved_inst;
  (__return_storage_ptr__->begin_).predicate_.copied_inst = local_78.predicate_.copied_inst;
  (__return_storage_ptr__->begin_).predicate_.loop = local_78.predicate_.loop;
  (__return_storage_ptr__->end_).cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>
  ._M_cur = (__node_type *)
            local_50.cur_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  (__return_storage_ptr__->end_).end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>
  ._M_cur = (__node_type *)
            local_50.end_.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur;
  (__return_storage_ptr__->end_).predicate_.moved_inst = local_50.predicate_.moved_inst;
  (__return_storage_ptr__->end_).predicate_.copied_inst = local_50.predicate_.copied_inst;
  (__return_storage_ptr__->end_).predicate_.loop = local_50.predicate_.loop;
  return (Range *)local_50.predicate_.loop;
}

Assistant:

typename FilterIterator<SubIterator, Predicate>::Range MakeFilterIteratorRange(
    const SubIterator& begin, const SubIterator& end, Predicate predicate) {
  return typename FilterIterator<SubIterator, Predicate>::Range(
      MakeFilterIterator(begin, end, predicate),
      MakeFilterIterator(end, end, predicate));
}